

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t parse_file_extra_htime(archive_read *a,archive_entry *e,rar5 *rar,ssize_t *extra_data_size)

{
  wchar_t wVar1;
  size_t local_48;
  size_t value_len;
  size_t flags;
  ssize_t *psStack_30;
  char unix_time;
  ssize_t *extra_data_size_local;
  rar5 *rar_local;
  archive_entry *e_local;
  archive_read *a_local;
  
  flags._7_1_ = 0;
  value_len = 0;
  psStack_30 = extra_data_size;
  extra_data_size_local = (ssize_t *)rar;
  rar_local = (rar5 *)e;
  e_local = (archive_entry *)a;
  wVar1 = read_var_sized(a,&value_len,&local_48);
  if (wVar1 == L'\0') {
    a_local._4_4_ = L'\x01';
  }
  else {
    *psStack_30 = *psStack_30 - local_48;
    wVar1 = consume((archive_read *)e_local,local_48);
    if (wVar1 == L'\0') {
      flags._7_1_ = (byte)value_len & 1;
      if ((value_len & 2) != 0) {
        parse_htime_item((archive_read *)e_local,flags._7_1_,
                         (uint64_t *)(extra_data_size_local + 0x97a),psStack_30);
        archive_entry_set_mtime((archive_entry *)rar_local,extra_data_size_local[0x97a],0);
      }
      if ((value_len & 4) != 0) {
        parse_htime_item((archive_read *)e_local,flags._7_1_,
                         (uint64_t *)(extra_data_size_local + 0x97b),psStack_30);
        archive_entry_set_ctime((archive_entry *)rar_local,extra_data_size_local[0x97b],0);
      }
      if ((value_len & 8) != 0) {
        parse_htime_item((archive_read *)e_local,flags._7_1_,
                         (uint64_t *)(extra_data_size_local + 0x97c),psStack_30);
        archive_entry_set_atime((archive_entry *)rar_local,extra_data_size_local[0x97c],0);
      }
      if ((value_len & 0x10) != 0) {
        wVar1 = read_u32((archive_read *)e_local,(uint32_t *)(extra_data_size_local + 0x97d));
        if (wVar1 == L'\0') {
          return L'\x01';
        }
        *psStack_30 = *psStack_30 + -4;
      }
      a_local._4_4_ = L'\0';
    }
    else {
      a_local._4_4_ = L'\x01';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int parse_file_extra_htime(struct archive_read* a,
    struct archive_entry* e, struct rar5* rar, ssize_t* extra_data_size)
{
	char unix_time = 0;
	size_t flags = 0;
	size_t value_len;

	enum HTIME_FLAGS {
		IS_UNIX       = 0x01,
		HAS_MTIME     = 0x02,
		HAS_CTIME     = 0x04,
		HAS_ATIME     = 0x08,
		HAS_UNIX_NS   = 0x10,
	};

	if(!read_var_sized(a, &flags, &value_len))
		return ARCHIVE_EOF;

	*extra_data_size -= value_len;
	if(ARCHIVE_OK != consume(a, value_len)) {
		return ARCHIVE_EOF;
	}

	unix_time = flags & IS_UNIX;

	if(flags & HAS_MTIME) {
		parse_htime_item(a, unix_time, &rar->file.e_mtime,
		    extra_data_size);
		archive_entry_set_mtime(e, rar->file.e_mtime, 0);
	}

	if(flags & HAS_CTIME) {
		parse_htime_item(a, unix_time, &rar->file.e_ctime,
		    extra_data_size);
		archive_entry_set_ctime(e, rar->file.e_ctime, 0);
	}

	if(flags & HAS_ATIME) {
		parse_htime_item(a, unix_time, &rar->file.e_atime,
		    extra_data_size);
		archive_entry_set_atime(e, rar->file.e_atime, 0);
	}

	if(flags & HAS_UNIX_NS) {
		if(!read_u32(a, &rar->file.e_unix_ns))
			return ARCHIVE_EOF;

		*extra_data_size -= 4;
	}

	return ARCHIVE_OK;
}